

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O0

void __thiscall
Minisat::vec<Minisat::lbool,_int>::clear(vec<Minisat::lbool,_int> *this,bool dealloc)

{
  byte in_SIL;
  long *in_RDI;
  Size i;
  int local_10;
  
  if (*in_RDI != 0) {
    for (local_10 = 0; local_10 < (int)in_RDI[1]; local_10 = local_10 + 1) {
    }
    *(undefined4 *)(in_RDI + 1) = 0;
    if ((in_SIL & 1) != 0) {
      xfree((void *)0xa3c4c1);
      *in_RDI = 0;
      *(undefined4 *)((long)in_RDI + 0xc) = 0;
    }
  }
  return;
}

Assistant:

void vec<T,_Size>::clear(bool dealloc) {
    if (data != NULL){
        for (Size i = 0; i < sz; i++) data[i].~T();
        sz = 0;
        if (dealloc) xfree(data), data = NULL, cap = 0; } }